

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O2

int Cnf_CutSuperAreaFlow(Vec_Ptr_t *vSuper,int *pAreaFlows)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  int i;
  
  iVar2 = vSuper->nSize;
  iVar4 = iVar2 * 100 + 100;
  i = 0;
  do {
    if (iVar2 <= i) {
      return iVar4;
    }
    pvVar3 = Vec_PtrEntry(vSuper,i);
    uVar1 = *(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x18);
    if (0xfffffffd < (uVar1 & 7) - 7) {
      if (uVar1 < 0x40) {
        __assert_fail("pLeaf->nRefs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMap.c"
                      ,0x53,"int Cnf_CutSuperAreaFlow(Vec_Ptr_t *, int *)");
      }
      iVar4 = iVar4 + pAreaFlows[*(int *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24)] /
                      (int)(uVar1 >> 6);
    }
    i = i + 1;
    iVar2 = vSuper->nSize;
  } while( true );
}

Assistant:

int Cnf_CutSuperAreaFlow( Vec_Ptr_t * vSuper, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i, nAreaFlow;
    nAreaFlow = 100 * (Vec_PtrSize(vSuper) + 1);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
    {
        pLeaf = Aig_Regular(pLeaf);
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        nAreaFlow += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
    return nAreaFlow;
}